

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Check.cpp
# Opt level: O0

string * __thiscall Check::getName_abi_cxx11_(string *__return_storage_ptr__,Check *this)

{
  Check *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

string Check::getName() const{
	return name;
}